

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_optimize_swamp_shrine_map.hpp
# Opt level: O0

void __thiscall
PatchOptimizeSwampShrineMap::inject_code(PatchOptimizeSwampShrineMap *this,ROM *rom,World *world)

{
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  uint32_t uVar1;
  uint32_t address;
  Map *this_00;
  allocator<char> local_1f9;
  string local_1f8;
  uint32_t local_1d8;
  allocator<md::AddressRegister> local_1d1;
  uint32_t update_func_addr;
  iterator local_1c0;
  size_type local_1b8;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_1b0;
  allocator<md::DataRegister> local_191;
  DataRegister local_190;
  iterator local_180;
  size_type local_178;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_170;
  allocator<char> local_151;
  string local_150;
  allocator<md::AddressRegister> local_129;
  AddressRegister local_128;
  iterator local_118;
  size_type local_110;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_108;
  allocator<md::DataRegister> local_ed [13];
  DataRegister local_e0;
  iterator local_d0;
  size_type local_c8;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_c0;
  undefined1 local_a8 [8];
  Code func;
  uint32_t func_handle_platforms;
  uint32_t func_handle_buttons;
  uint32_t func_disable_spikeballs_progessively;
  World *world_local;
  ROM *rom_local;
  PatchOptimizeSwampShrineMap *this_local;
  
  uVar1 = inject_func_disable_spikeballs_progessively(rom);
  address = inject_func_handle_buttons(rom);
  func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
       inject_func_handle_platforms(rom);
  md::Code::Code((Code *)local_a8);
  md::DataRegister::DataRegister(&local_e0,'\0');
  local_d0 = &local_e0;
  local_c8 = 1;
  std::allocator<md::DataRegister>::allocator(local_ed);
  __l_02._M_len = local_c8;
  __l_02._M_array = local_d0;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_c0,__l_02,local_ed);
  md::AddressRegister::AddressRegister(&local_128,'\0');
  local_118 = &local_128;
  local_110 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_129);
  __l_01._M_len = local_110;
  __l_01._M_array = local_118;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_108,__l_01,&local_129);
  md::Code::movem_to_stack((Code *)local_a8,&local_c0,&local_108);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_108);
  std::allocator<md::AddressRegister>::~allocator(&local_129);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_c0);
  std::allocator<md::DataRegister>::~allocator(local_ed);
  md::Code::jsr((Code *)local_a8,uVar1);
  md::Code::jsr((Code *)local_a8,address);
  md::Code::jsr((Code *)local_a8,func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_
               );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"ret",&local_151);
  md::Code::label((Code *)local_a8,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  std::allocator<char>::~allocator(&local_151);
  md::DataRegister::DataRegister(&local_190,'\0');
  local_180 = &local_190;
  local_178 = 1;
  std::allocator<md::DataRegister>::allocator(&local_191);
  __l_00._M_len = local_178;
  __l_00._M_array = local_180;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_170,__l_00,&local_191);
  md::AddressRegister::AddressRegister((AddressRegister *)&update_func_addr,'\0');
  local_1c0 = (iterator)&update_func_addr;
  local_1b8 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_1d1);
  __l._M_len = local_1b8;
  __l._M_array = local_1c0;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_1b0,__l,&local_1d1);
  md::Code::movem_from_stack((Code *)local_a8,&local_170,&local_1b0);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_1b0);
  std::allocator<md::AddressRegister>::~allocator(&local_1d1);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_170);
  std::allocator<md::DataRegister>::~allocator(&local_191);
  md::Code::rts((Code *)local_a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f8,"",&local_1f9);
  uVar1 = md::ROM::inject_code(rom,(Code *)local_a8,&local_1f8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  local_1d8 = uVar1;
  this_00 = World::map(world,0x17);
  Map::map_update_addr(this_00,local_1d8);
  md::Code::~Code((Code *)local_a8);
  return;
}

Assistant:

void inject_code(md::ROM& rom, World& world) override
    {
        uint32_t func_disable_spikeballs_progessively = inject_func_disable_spikeballs_progessively(rom);
        uint32_t func_handle_buttons = inject_func_handle_buttons(rom);
        uint32_t func_handle_platforms = inject_func_handle_platforms(rom);

        md::Code func;
        func.movem_to_stack({ reg_D0 }, { reg_A0 });
        {
            func.jsr(func_disable_spikeballs_progessively);
            func.jsr(func_handle_buttons);
            func.jsr(func_handle_platforms);
        }
        func.label("ret");
        func.movem_from_stack({ reg_D0 }, { reg_A0 });
        func.rts();

        uint32_t update_func_addr = rom.inject_code(func);
        world.map(MAP_SWAMP_SHRINE_23)->map_update_addr(update_func_addr);
    }